

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O3

int __thiscall
r_comp::RepliStruct::clone
          (RepliStruct *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  undefined8 *puVar2;
  __fn *__fn_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __fn *p_Var3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__child_stack_00;
  undefined8 *puVar4;
  _Alloc_hider local_38;
  
  *(undefined8 *)this = 0;
  p_Var3 = __fn;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<r_comp::RepliStruct,std::allocator<r_comp::RepliStruct>,r_comp::RepliStruct::Type_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->cmd,(RepliStruct **)this,
             (allocator<r_comp::RepliStruct> *)&stack0xffffffffffffffc0,(Type *)__fn);
  std::__cxx11::string::_M_assign((string *)(*(long *)this + 8));
  std::__cxx11::string::_M_assign((string *)(*(long *)this + 0x48));
  std::__cxx11::string::_M_assign((string *)(*(long *)this + 0x28));
  lVar1 = *(long *)this;
  *(undefined8 *)(lVar1 + 200) = *(undefined8 *)(__fn + 200);
  std::__cxx11::string::_M_assign((string *)(lVar1 + 0x68));
  lVar1 = *(long *)this;
  *(undefined8 *)(lVar1 + 0xa8) = *(undefined8 *)(__fn + 0xa8);
  std::__cxx11::string::_M_assign((string *)(lVar1 + 0x88));
  puVar4 = *(undefined8 **)(__fn + 0xb0);
  puVar2 = *(undefined8 **)(__fn + 0xb8);
  if (puVar4 != puVar2) {
    __child_stack_00 = extraout_RDX;
    do {
      __fn_00 = (__fn *)*puVar4;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4[1];
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      lVar1 = *(long *)this;
      clone((RepliStruct *)&stack0xffffffffffffffc0,__fn_00,__child_stack_00,(int)p_Var3,__arg);
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>
      ::emplace_back<std::shared_ptr<r_comp::RepliStruct>>
                ((vector<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>
                  *)(lVar1 + 0xb0),(shared_ptr<r_comp::RepliStruct> *)&stack0xffffffffffffffc0);
      __child_stack_00 = extraout_RDX_00;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p);
        __child_stack_00 = extraout_RDX_01;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        __child_stack_00 = extraout_RDX_02;
      }
      puVar4 = puVar4 + 2;
    } while (puVar4 != puVar2);
  }
  return (int)this;
}

Assistant:

RepliStruct::Ptr RepliStruct::clone() const
{
    RepliStruct::Ptr newStruct = std::make_shared<RepliStruct>(type);
    newStruct->cmd = cmd;
    newStruct->label = label;
    newStruct->tail = tail;
    newStruct->parent = parent;
    newStruct->error = error;
    newStruct->line = line;
    newStruct->fileName = fileName;

    for (RepliStruct::Ptr arg : args) {
        newStruct->args.push_back((arg)->clone());
    }

    return newStruct;
}